

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_redraw_section(wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2)

{
  int *piVar1;
  int *piVar2;
  term_win *ptVar3;
  wchar_t **ppwVar4;
  term *ptVar5;
  wchar_t wVar6;
  ulong uVar7;
  wchar_t wVar8;
  ulong uVar9;
  long lVar10;
  
  ptVar5 = Term;
  wVar6 = Term->hgt + L'\xffffffff';
  if (y2 < Term->hgt) {
    wVar6 = y2;
  }
  wVar8 = Term->wid + L'\xffffffff';
  if (x2 < Term->wid) {
    wVar8 = x2;
  }
  uVar9 = (ulong)(uint)y1;
  if (y1 < L'\x01') {
    uVar9 = 0;
  }
  Term->y1 = (wchar_t)uVar9;
  ptVar5->y2 = wVar6;
  if ((wchar_t)uVar9 <= wVar6) {
    uVar7 = (ulong)(uint)x1;
    if (x1 < L'\x01') {
      uVar7 = 0;
    }
    piVar1 = ptVar5->x1;
    piVar2 = ptVar5->x2;
    ptVar3 = ptVar5->old;
    ppwVar4 = ptVar3->c;
    lVar10 = uVar9 - 1;
    do {
      if (0 < (int)uVar7) {
        uVar7 = (ulong)((int)uVar7 - (uint)(ptVar3->a[lVar10 + 1][uVar7] == 0xff));
      }
      wVar6 = (wchar_t)uVar7;
      piVar1[lVar10 + 1] = wVar6;
      piVar2[lVar10 + 1] = wVar8;
      if (wVar6 <= wVar8) {
        memset(ppwVar4[lVar10 + 1] + wVar6,0,(ulong)(uint)(wVar8 - wVar6) * 4 + 4);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < ptVar5->y2);
  }
  Term_fresh();
  return 0;
}

Assistant:

errr Term_redraw_section(int x1, int y1, int x2, int y2)
{
	int i, j;

	wchar_t *c_ptr;

	/* Bounds checking */
	if (y2 >= Term->hgt) y2 = Term->hgt - 1;
	if (x2 >= Term->wid) x2 = Term->wid - 1;
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;


	/* Set y limits */
	Term->y1 = y1;
	Term->y2 = y2;

	/* Set the x limits */
	for (i = Term->y1; i <= Term->y2; i++) {
		if ((x1 > 0) && (Term->old->a[i][x1] == 255))
			x1--;

		Term->x1[i] = x1;
		Term->x2[i] = x2;

		c_ptr = Term->old->c[i];

		/* Clear the section so it is redrawn */
		for (j = x1; j <= x2; j++) {
			/* Hack - set the old character to "none" */
			c_ptr[j] = 0;
		}
	}

	/* Hack -- Refresh */
	Term_fresh();

	/* Success */
	return (0);
}